

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_sock_sendfile_from_fd(int fd,fio_packet_s *packet)

{
  uintptr_t *puVar1;
  ssize_t sVar2;
  
  sVar2 = sendfile64(fd,*(int *)&packet->data,(__off64_t *)&packet->offset,packet->length);
  if (sVar2 < 0) {
    sVar2 = -1;
  }
  else {
    puVar1 = &packet->length;
    *puVar1 = *puVar1 - sVar2;
    if (*puVar1 == 0) {
      fio_sock_packet_rotate_unsafe((long)fd);
    }
  }
  return (int)sVar2;
}

Assistant:

static int fio_sock_sendfile_from_fd(int fd, fio_packet_s *packet) {
  ssize_t sent;
  sent =
      sendfile64(fd, packet->data.fd, (off_t *)&packet->offset, packet->length);
  if (sent < 0)
    return -1;
  packet->length -= sent;
  if (!packet->length)
    fio_sock_packet_rotate_unsafe(fd);
  return sent;
}